

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefileTargetGenerator.cxx
# Opt level: O2

void __thiscall
cmMakefileTargetGenerator::CreateLinkScript
          (cmMakefileTargetGenerator *this,char *name,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *link_commands,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *makefile_commands,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *makefile_depends)

{
  pointer pbVar1;
  cmLocalUnixMakefileGenerator3 *this_00;
  ostream *poVar2;
  string *psVar3;
  string *link_command_1;
  pointer pbVar4;
  string linkScriptName;
  string link_command;
  string local_2b8;
  string local_298;
  cmGeneratedFileStream linkScriptStream;
  
  std::__cxx11::string::string((string *)&linkScriptName,(string *)&this->TargetBuildDirectoryFull);
  std::__cxx11::string::append((char *)&linkScriptName);
  std::__cxx11::string::append((char *)&linkScriptName);
  cmGeneratedFileStream::cmGeneratedFileStream(&linkScriptStream,&linkScriptName,false,None);
  cmGeneratedFileStream::SetCopyIfDifferent(&linkScriptStream,true);
  pbVar1 = (link_commands->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  for (pbVar4 = (link_commands->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start; pbVar4 != pbVar1; pbVar4 = pbVar4 + 1) {
    if ((pbVar4->_M_string_length != 0) && (*(pbVar4->_M_dataplus)._M_p != ':')) {
      poVar2 = std::operator<<((ostream *)&linkScriptStream,(string *)pbVar4);
      std::operator<<(poVar2,"\n");
    }
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&link_command,"$(CMAKE_COMMAND) -E cmake_link_script ",
             (allocator<char> *)&local_2b8);
  this_00 = this->LocalGenerator;
  psVar3 = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_((cmLocalGenerator *)this_00);
  cmLocalGenerator::MaybeConvertToRelativePath
            (&local_298,(cmLocalGenerator *)this_00,psVar3,&linkScriptName);
  cmOutputConverter::ConvertToOutputFormat
            (&local_2b8,
             &(this_00->super_cmLocalCommonGenerator).super_cmLocalGenerator.super_cmOutputConverter
             ,&local_298,SHELL);
  std::__cxx11::string::append((string *)&link_command);
  std::__cxx11::string::~string((string *)&local_2b8);
  std::__cxx11::string::~string((string *)&local_298);
  std::__cxx11::string::append((char *)&link_command);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)makefile_commands,
             &link_command);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)makefile_depends,
             &linkScriptName);
  std::__cxx11::string::~string((string *)&link_command);
  cmGeneratedFileStream::~cmGeneratedFileStream(&linkScriptStream);
  std::__cxx11::string::~string((string *)&linkScriptName);
  return;
}

Assistant:

void cmMakefileTargetGenerator::CreateLinkScript(
  const char* name, std::vector<std::string> const& link_commands,
  std::vector<std::string>& makefile_commands,
  std::vector<std::string>& makefile_depends)
{
  // Create the link script file.
  std::string linkScriptName = this->TargetBuildDirectoryFull;
  linkScriptName += "/";
  linkScriptName += name;
  cmGeneratedFileStream linkScriptStream(linkScriptName);
  linkScriptStream.SetCopyIfDifferent(true);
  for (std::string const& link_command : link_commands) {
    // Do not write out empty commands or commands beginning in the
    // shell no-op ":".
    if (!link_command.empty() && link_command[0] != ':') {
      linkScriptStream << link_command << "\n";
    }
  }

  // Create the makefile command to invoke the link script.
  std::string link_command = "$(CMAKE_COMMAND) -E cmake_link_script ";
  link_command += this->LocalGenerator->ConvertToOutputFormat(
    this->LocalGenerator->MaybeConvertToRelativePath(
      this->LocalGenerator->GetCurrentBinaryDirectory(), linkScriptName),
    cmOutputConverter::SHELL);
  link_command += " --verbose=$(VERBOSE)";
  makefile_commands.push_back(std::move(link_command));
  makefile_depends.push_back(std::move(linkScriptName));
}